

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_statemachine(Curl_easy *data,connectdata *conn)

{
  anon_union_280_9_4527acc7_for_proto *pp;
  int *piVar1;
  undefined1 *puVar2;
  byte *pbVar3;
  char cVar4;
  uchar uVar5;
  FTP *pFVar6;
  long lVar7;
  FILEPROTO *pFVar8;
  ulong uVar9;
  curl_trc_feat *pcVar10;
  ConnectBits CVar11;
  undefined8 uVar12;
  proxy_info *ppVar13;
  char *pcVar14;
  _Bool _Var15;
  CURLcode CVar16;
  int iVar17;
  resolve_t rVar18;
  void *pvVar19;
  size_t sVar20;
  ulong uVar21;
  time_t tVar22;
  char *pcVar23;
  char *pcVar24;
  byte bVar25;
  ftpstate fVar26;
  ftpport fcmd;
  size_t sVar27;
  curl_off_t size_00;
  connectdata *pcVar28;
  ip_quadruple *piVar29;
  size_t *in_R8;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  int i;
  long lVar35;
  Curl_dns_entry *addr;
  ulong local_190;
  int ftpcode;
  connectdata *local_180;
  curl_off_t filesize;
  uint local_170;
  uint local_16c;
  int local_168;
  int local_164;
  int local_160;
  size_t nread;
  curl_off_t size;
  undefined8 uStack_130;
  size_t local_128;
  
  nread = 0;
  pp = &conn->proto;
  if ((conn->proto).ftpc.pp.sendleft != 0) {
    CVar16 = Curl_pp_flushsend(data,&(pp->ftpc).pp);
    return CVar16;
  }
  CVar16 = ftp_readresp(data,(int)pp,(pingpong *)&ftpcode,(int *)&nread,in_R8);
  if (CVar16 != CURLE_OK) {
    return CVar16;
  }
  if (ftpcode == 0) {
    return CURLE_OK;
  }
  fVar26 = (conn->proto).ftpc.state;
  switch(fVar26) {
  case '\x01':
    if (ftpcode == 0xdc) {
      if ((data->set).use_ssl == '\0') goto LAB_001289ed;
    }
    else {
      if (ftpcode != 0xe6) {
        Curl_failf(data,"Got a %03d ftp-server response when 220 was expected");
        return CURLE_WEIRD_SERVER_REPLY;
      }
      if (((data->set).use_ssl < 2) || (((conn->bits).field_0x2 & 4) != 0)) {
        ftpcode = 0xe6;
        goto LAB_00127af7;
      }
    }
    if (((conn->bits).field_0x2 & 4) != 0) {
LAB_001289ed:
      CVar16 = ftp_state_user(data,conn);
      return CVar16;
    }
    (conn->proto).ftpc.count3 = 0;
    bVar25 = (data->set).ftpsslauth;
    if (2 < bVar25) {
      Curl_failf(data,"unsupported parameter to CURLOPT_FTPSSLAUTH: %d");
      return CURLE_UNKNOWN_OPTION;
    }
    iVar17 = *(int *)(&DAT_0016cfa0 + (uint)bVar25 * 4);
    lVar35 = *(long *)(&DAT_0016cfb0 + (ulong)(uint)bVar25 * 8);
    (conn->proto).ftpc.count2 = *(int *)(&DAT_0016cf94 + (uint)bVar25 * 4);
    (conn->proto).ftpc.count1 = iVar17;
    CVar16 = Curl_pp_sendf(data,&(pp->ftpc).pp,"AUTH %s",ftp_statemachine::ftpauth[lVar35]);
    if (CVar16 != CURLE_OK) {
      return CVar16;
    }
    fVar26 = '\x02';
    goto LAB_00128bd7;
  case '\x02':
    if ((conn->proto).ftpc.pp.overflow != 0) {
      return CURLE_WEIRD_SERVER_REPLY;
    }
    if ((ftpcode == 0x14e) || (ftpcode == 0xea)) {
      _Var15 = Curl_conn_is_ssl(conn,0);
      if ((!_Var15) && (CVar16 = Curl_ssl_cfilter_add(data,conn,0), CVar16 != CURLE_OK)) {
        return CURLE_USE_SSL_FAILED;
      }
      CVar16 = Curl_conn_connect(data,0,true,(_Bool *)&size);
      if (CVar16 != CURLE_OK) {
        return CVar16;
      }
      conn->bits = (ConnectBits)((ulong)conn->bits & 0xfffffffffff9ffff | 0x40000);
      goto LAB_001289ed;
    }
    iVar17 = (conn->proto).ftpc.count3;
    if (0 < iVar17) {
      if (1 < (data->set).use_ssl) {
        return CURLE_USE_SSL_FAILED;
      }
      goto LAB_001289ed;
    }
    (conn->proto).ftpc.count3 = iVar17 + 1;
    lVar35 = (long)(conn->proto).ftpc.count1 + (long)(conn->proto).ftpc.count2;
    (conn->proto).ftpc.count1 = (int)lVar35;
    pcVar23 = ftp_statemachine::ftpauth[lVar35];
    pcVar24 = "AUTH %s";
    goto LAB_001281c4;
  case '\x03':
  case '\x04':
LAB_00127af7:
    CVar16 = ftp_state_user_resp(data,ftpcode);
    break;
  case '\x05':
    if (ftpcode == 0xe6) {
      CVar16 = ftp_state_loggedin(data);
    }
    else {
      Curl_failf(data,"ACCT rejected by server: %03d");
      CVar16 = CURLE_FTP_WEIRD_PASS_REPLY;
    }
    break;
  case '\x06':
    uVar12 = 0x50;
    if ((data->set).use_ssl == '\x02') {
      uVar12 = 0x43;
    }
    CVar16 = Curl_pp_sendf(data,&(pp->ftpc).pp,"PROT %c",uVar12);
    if (CVar16 != CURLE_OK) {
      return CVar16;
    }
    fVar26 = '\a';
    goto LAB_00128bd7;
  case '\a':
    bVar25 = (data->set).use_ssl;
    if (ftpcode - 200U < 100) {
      conn->bits = (ConnectBits)
                   ((ulong)conn->bits & 0xfffffffffffdffff | (ulong)(bVar25 != 2) << 0x11);
    }
    else if (2 < bVar25) {
      return CURLE_USE_SSL_FAILED;
    }
    if ((data->set).ftp_ccc == '\0') goto LAB_001284a3;
    CVar16 = Curl_pp_sendf(data,&(pp->ftpc).pp,"%s","CCC");
    if (CVar16 != CURLE_OK) {
      return CVar16;
    }
    fVar26 = '\b';
    goto LAB_00128bd7;
  case '\b':
    if ((ftpcode < 500) &&
       (CVar16 = Curl_ssl_cfilter_remove(data,0,(data->set).ftp_ccc == '\x02'), CVar16 != CURLE_OK))
    {
      Curl_failf(data,"Failed to clear the command channel (CCC)");
      return CVar16;
    }
LAB_001284a3:
    CVar16 = ftp_state_pwd(data,conn);
    break;
  case '\t':
    if (ftpcode == 0x101) {
      pcVar23 = Curl_dyn_ptr(&(conn->proto).ftpc.pp.recvbuf);
      Curl_dyn_init((dynbuf *)&size,1000);
      for (pcVar23 = pcVar23 + 4; (cVar4 = *pcVar23, cVar4 != '\0' && (cVar4 != '\n'));
          pcVar23 = pcVar23 + 1) {
        if (cVar4 == '\"') goto LAB_00128992;
      }
LAB_00128ca4:
      Curl_dyn_free((dynbuf *)&size);
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
         ((pcVar10 = (data->state).feat, pcVar10 == (curl_trc_feat *)0x0 || (0 < pcVar10->log_level)
          ))) {
        Curl_infof(data,"Failed to figure out path");
      }
    }
    goto LAB_00128cdf;
  case '\n':
    if (ftpcode == 0xd7) {
      pcVar23 = Curl_dyn_ptr(&(conn->proto).ftpc.pp.recvbuf);
      pcVar23 = pcVar23 + 3;
      do {
        pcVar24 = pcVar23;
        bVar25 = pcVar24[1];
        pcVar23 = pcVar24 + 1;
      } while (bVar25 == 0x20);
      sVar27 = 0;
      while ((bVar25 & 0xdf) != 0) {
        lVar35 = sVar27 + 2;
        sVar27 = sVar27 + 1;
        bVar25 = pcVar24[lVar35];
      }
      pcVar23 = (char *)Curl_memdup0(pcVar24 + 1,sVar27);
      if (pcVar23 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      iVar17 = curl_strequal(pcVar23,"OS/400");
      if (iVar17 != 0) {
        CVar16 = Curl_pp_sendf(data,&(pp->ftpc).pp,"%s","SITE NAMEFMT 1");
        if (CVar16 != CURLE_OK) {
          (*Curl_cfree)(pcVar23);
          return CVar16;
        }
        (*Curl_cfree)((conn->proto).ftpc.server_os);
        (conn->proto).ftpc.server_os = pcVar23;
        fVar26 = '\v';
        goto LAB_00128bd7;
      }
      (*Curl_cfree)((conn->proto).ftpc.server_os);
      (conn->proto).ftpc.server_os = pcVar23;
    }
    goto LAB_00128cdf;
  case '\v':
    if (ftpcode == 0xfa) {
      ftp_state_pwd(data,conn);
      return CURLE_OK;
    }
LAB_00128cdf:
    CVar16 = CURLE_OK;
    _ftp_state(data,'\0');
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
       (((pcVar10 = (data->state).feat, pcVar10 == (curl_trc_feat *)0x0 || (0 < pcVar10->log_level))
        && (0 < Curl_trc_feat_ftp.log_level)))) {
      if (data->conn == (connectdata *)0x0) {
        pcVar23 = "???";
      }
      else {
        pcVar23 = ftp_state_names[(data->conn->proto).ftpc.state];
      }
      CVar16 = CURLE_OK;
      Curl_trc_ftp(data,"[%s] protocol connect phase DONE",pcVar23);
    }
    break;
  case '\f':
  case '\r':
  case '\x0e':
  case '\x0f':
    if ((ftpcode < 400) || ((conn->proto).ftpc.count2 != 0)) {
      CVar16 = ftp_state_quote(data,false,fVar26);
    }
    else {
      Curl_failf(data,"QUOT command failed with %03d");
      CVar16 = CURLE_QUOTE_ERROR;
    }
    break;
  case '\x10':
    if (ftpcode - 200U < 100) {
      (conn->proto).ftpc.count2 = 0;
      iVar17 = (conn->proto).ftpc.cwdcount;
      (conn->proto).ftpc.cwdcount = iVar17 + 1;
      if ((conn->proto).ftpc.dirdepth <= iVar17) {
        CVar16 = ftp_state_mdtm(data);
        return CVar16;
      }
      pcVar23 = (conn->proto).ftpc.dirs[iVar17];
      goto LAB_001281bd;
    }
    uVar5 = (data->set).ftp_create_missing_dirs;
    if (((uVar5 == '\0') || (lVar35 = (long)(conn->proto).ftpc.cwdcount, lVar35 == 0)) ||
       ((conn->proto).ftpc.count2 != 0)) {
      Curl_failf(data,"Server denied you to change to the given directory");
      pbVar3 = (byte *)((long)&conn->proto + 0x112);
      *pbVar3 = *pbVar3 | 0x10;
      return CURLE_REMOTE_ACCESS_DENIED;
    }
    (conn->proto).ftpc.count2 = 1;
    *(uint *)((long)&conn->proto + 0x108) = (uint)(uVar5 == '\x02');
    CVar16 = Curl_pp_sendf(data,&(pp->ftpc).pp,"MKD %s",(conn->proto).ftpc.dirs[lVar35 + -1]);
    if (CVar16 != CURLE_OK) {
      return CVar16;
    }
    fVar26 = '\x11';
    goto LAB_00128bd7;
  case '\x11':
    if (99 < ftpcode - 200U) {
      piVar1 = &(conn->proto).ftpc.count3;
      iVar17 = *piVar1;
      *piVar1 = *piVar1 + -1;
      if (iVar17 == 0) {
        Curl_failf(data,"Failed to MKD dir: %03d");
        return CURLE_REMOTE_ACCESS_DENIED;
      }
    }
    _ftp_state(data,'\x10');
    pcVar23 = (conn->proto).ftpc.dirs[(long)(conn->proto).ftpc.cwdcount + -1];
LAB_001281bd:
    pcVar24 = "CWD %s";
LAB_001281c4:
    CVar16 = Curl_pp_sendf(data,&(pp->ftpc).pp,pcVar24,pcVar23);
    break;
  case '\x12':
    pFVar8 = (data->req).p.file;
    if (ftpcode == 0x226) {
      if ((((data->set).field_0x8cd & 0x10) != 0) &&
         ((pcVar10 = (data->state).feat, pcVar10 == (curl_trc_feat *)0x0 || (0 < pcVar10->log_level)
          ))) {
        pcVar23 = "MDTM failed: file does not exist or permission problem, continuing";
LAB_001286ad:
        Curl_infof(data,pcVar23);
      }
    }
    else if (ftpcode == 0xd5) {
      pcVar28 = data->conn;
      pcVar23 = Curl_dyn_ptr(&(pcVar28->proto).ftpc.pp.recvbuf);
      sVar20 = strlen(pcVar23 + 4);
      if ((((0xd < sVar20) && (uVar33 = pcVar23[9] + -0x210 + pcVar23[8] * 10, (int)uVar33 < 0xd))
          && (uVar30 = pcVar23[0xb] + -0x210 + pcVar23[10] * 10, (int)uVar30 < 0x20)) &&
         (((uVar31 = pcVar23[0xd] + -0x210 + pcVar23[0xc] * 10, (int)uVar31 < 0x18 &&
           (uVar32 = pcVar23[0xf] + -0x210 + pcVar23[0xe] * 10, (int)uVar32 < 0x3c)) &&
          (uVar34 = pcVar23[0x11] + -0x210 + pcVar23[0x10] * 10, (int)uVar34 < 0x3d)))) {
        curl_msnprintf((char *)&size,0x18,"%04d%02d%02d %02d:%02d:%02d GMT",
                       (ulong)((((int)pcVar23[5] + pcVar23[4] * 10) * 100 +
                               (int)pcVar23[7] + pcVar23[6] * 10) - 0xd050),(ulong)uVar33,
                       (ulong)uVar30,(ulong)uVar31,(ulong)uVar32,(ulong)uVar34);
        tVar22 = Curl_getdate_capped((char *)&size);
        (data->info).filetime = tVar22;
      }
      if (((((data->req).field_0xdb & 2) != 0) && ((pcVar28->proto).ftpc.file != (char *)0x0)) &&
         ((((data->set).field_0x8ca & 0x80) != 0 && (lVar35 = (data->info).filetime, -1 < lVar35))))
      {
        CVar16 = Curl_gmtime(lVar35,(tm *)&filesize);
        if (CVar16 != CURLE_OK) {
          return CVar16;
        }
        iVar17 = 6;
        if (local_160 != 0) {
          iVar17 = local_160 + -1;
        }
        iVar17 = curl_msnprintf((char *)&size,0x80,
                                "Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
                                Curl_wkday[iVar17],(ulong)local_16c,Curl_month[local_168],
                                (ulong)(local_164 + 0x76c),(ulong)local_170,(ulong)filesize >> 0x20,
                                filesize & 0xffffffff);
        CVar16 = client_write_header(data,(char *)&size,(long)iVar17);
        if (CVar16 != CURLE_OK) {
          return CVar16;
        }
      }
    }
    else if ((((data->set).field_0x8cd & 0x10) != 0) &&
            ((pcVar10 = (data->state).feat, pcVar10 == (curl_trc_feat *)0x0 ||
             (0 < pcVar10->log_level)))) {
      pcVar23 = "unsupported MDTM reply format";
      goto LAB_001286ad;
    }
    uVar5 = (data->set).timecondition;
    if (uVar5 != '\0') {
      uVar21 = (data->info).filetime;
      if (((long)uVar21 < 1) || (uVar9 = (data->set).timevalue, (long)uVar9 < 1)) {
        if ((((data->set).field_0x8cd & 0x10) != 0) &&
           ((pcVar10 = (data->state).feat, pcVar10 == (curl_trc_feat *)0x0 ||
            (0 < pcVar10->log_level)))) {
          Curl_infof(data,"Skipping time comparison");
        }
      }
      else if (uVar5 == '\x02') {
        if (uVar9 < uVar21) {
          if ((((data->set).field_0x8cd & 0x10) != 0) &&
             ((pcVar10 = (data->state).feat, pcVar10 == (curl_trc_feat *)0x0 ||
              (0 < pcVar10->log_level)))) {
            pcVar23 = "The requested document is not old enough";
LAB_00128bb7:
            Curl_infof(data,pcVar23);
          }
LAB_00128bc1:
          pFVar8->fd = 2;
          puVar2 = &(data->info).field_0xe4;
          *puVar2 = *puVar2 | 1;
          goto switchD_001279eb_default;
        }
      }
      else if (uVar21 <= uVar9) {
        if ((((data->set).field_0x8cd & 0x10) != 0) &&
           ((pcVar10 = (data->state).feat, pcVar10 == (curl_trc_feat *)0x0 ||
            (0 < pcVar10->log_level)))) {
          pcVar23 = "The requested document is not new enough";
          goto LAB_00128bb7;
        }
        goto LAB_00128bc1;
      }
    }
    CVar16 = ftp_state_type(data);
    break;
  case '\x13':
  case '\x14':
  case '\x15':
  case '\x16':
    CVar16 = ftp_state_type_resp(data,ftpcode,fVar26);
    break;
  case '\x17':
  case '\x18':
  case '\x19':
    filesize = -1;
    pcVar23 = Curl_dyn_ptr(&(data->conn->proto).ftpc.pp.recvbuf);
    if (ftpcode == 0xd5) {
      pcVar23 = pcVar23 + 4;
      pvVar19 = memchr(pcVar23,0xd,(data->conn->proto).ftpc.pp.nfinal);
      pcVar24 = pcVar23;
      if (pvVar19 != (void *)0x0) {
        pcVar14 = (char *)((long)pvVar19 + -2);
        if (*(char *)((long)pvVar19 + -1) != '\n') {
          pcVar14 = (char *)((long)pvVar19 + -1);
        }
        do {
          pcVar24 = pcVar14;
          if (pcVar24 <= pcVar23) break;
          pcVar14 = pcVar24 + -1;
        } while ((byte)(pcVar24[-1] - 0x30U) < 10);
      }
      curlx_strtoofft(pcVar24,(char **)0x0,10,&filesize);
    }
    else if (fVar26 != '\x19' && ftpcode == 0x226) {
      Curl_failf(data,"The file does not exist");
      return CURLE_REMOTE_FILE_NOT_FOUND;
    }
    if (fVar26 == '\x19') {
      (data->state).resume_from = filesize;
      CVar16 = ftp_state_ul_setup(data,true);
    }
    else if (fVar26 == '\x18') {
      Curl_pgrsSetDownloadSize(data,filesize);
      CVar16 = ftp_state_retr(data,filesize);
    }
    else {
      CVar16 = CURLE_OK;
      if (fVar26 == '\x17') {
        if (filesize == -1) {
          size_00 = -1;
        }
        else {
          iVar17 = curl_msnprintf((char *)&size,0x80,"Content-Length: %ld\r\n");
          CVar16 = client_write_header(data,(char *)&size,(long)iVar17);
          size_00 = filesize;
          if (CVar16 != CURLE_OK) {
            return CVar16;
          }
        }
        Curl_pgrsSetDownloadSize(data,size_00);
        CVar16 = ftp_state_rest(data,data->conn);
      }
    }
    break;
  case '\x1a':
  case '\x1b':
    if (fVar26 != '\x1b') {
      if (ftpcode == 0x15e) {
        size._0_1_ = 'A';
        size._1_1_ = 'c';
        size._2_1_ = 'c';
        size._3_1_ = 'e';
        size._4_1_ = 'p';
        size._5_1_ = 't';
        size._6_1_ = '-';
        size._7_1_ = 'r';
        uStack_130._0_1_ = 'a';
        uStack_130._1_1_ = 'n';
        uStack_130._2_1_ = 'g';
        uStack_130._3_1_ = 'e';
        uStack_130._4_1_ = 's';
        uStack_130._5_1_ = ':';
        uStack_130._6_1_ = ' ';
        uStack_130._7_1_ = 'b';
        local_128 = 0xa0d73657479;
        sVar20 = strlen((char *)&size);
        CVar16 = client_write_header(data,(char *)&size,sVar20);
        if (CVar16 != CURLE_OK) {
          return CVar16;
        }
      }
      CVar16 = ftp_state_prepare_transfer(data);
      return CVar16;
    }
    if (ftpcode != 0x15e) {
      Curl_failf(data,"Couldn\'t use REST");
      return CURLE_FTP_COULDNT_USE_REST;
    }
    CVar16 = Curl_pp_sendf(data,&(pp->ftpc).pp,"RETR %s",(conn->proto).ftpc.file);
    if (CVar16 != CURLE_OK) {
      return CVar16;
    }
    fVar26 = ' ';
    goto LAB_00128bd7;
  case '\x1c':
    if (ftpcode - 200U < 100) {
      if ((((data->set).field_0x8cd & 0x10) != 0) &&
         ((pcVar10 = (data->state).feat, pcVar10 == (curl_trc_feat *)0x0 || (0 < pcVar10->log_level)
          ))) {
        Curl_infof(data,"Connect data stream actively");
      }
      _ftp_state(data,'\0');
      CVar16 = ftp_dophase_done(data,false);
    }
    else {
      pcVar28 = data->conn;
      iVar17 = (pcVar28->proto).ftpc.count1;
      if (iVar17 == 0) {
        if ((((data->set).field_0x8cd & 0x10) != 0) &&
           ((pcVar10 = (data->state).feat, pcVar10 == (curl_trc_feat *)0x0 ||
            (0 < pcVar10->log_level)))) {
          Curl_infof(data,"disabling EPRT usage");
        }
        puVar2 = &(pcVar28->bits).field_0x2;
        *puVar2 = *puVar2 & 0xfe;
        fcmd = PORT;
      }
      else {
        fcmd = iVar17 + PORT;
        if (fcmd == DONE) {
          Curl_failf(data,"Failed to do PORT");
          return CURLE_FTP_PORT_FAILED;
        }
      }
      CVar16 = ftp_state_use_port(data,fcmd);
    }
    break;
  case '\x1d':
    if (ftpcode == 200) {
      CVar16 = ftp_state_use_pasv(data,conn);
    }
    else {
      Curl_failf(data,"PRET command not accepted: %03d");
      CVar16 = CURLE_FTP_PRET_FAILED;
    }
    break;
  case '\x1e':
    pcVar28 = data->conn;
    addr = (Curl_dns_entry *)0x0;
    local_190 = (ulong)(uint)ftpcode;
    pcVar23 = Curl_dyn_ptr(&(pcVar28->proto).ftpc.pp.recvbuf);
    pcVar23 = pcVar23 + 4;
    (*Curl_cfree)((pcVar28->proto).ftpc.newhost);
    (pcVar28->proto).ftpc.newhost = (char *)0x0;
    iVar17 = (pcVar28->proto).ftpc.count1;
    if ((int)local_190 == 0xe5 && iVar17 == 0) {
      pcVar23 = strchr(pcVar23,0x28);
      if ((((pcVar23 == (char *)0x0) || (cVar4 = pcVar23[1], pcVar23[2] != cVar4)) ||
          (pcVar23[3] != cVar4)) ||
         ((9 < (byte)(pcVar23[4] - 0x30U) ||
          (uVar21 = strtoul(pcVar23 + 4,(char **)&size,10), *(char *)size != cVar4)))) {
        pcVar23 = "Weirdly formatted EPSV reply";
      }
      else {
        if (uVar21 < 0x10000) {
          (pcVar28->proto).ftpc.newport = (unsigned_short)uVar21;
          if (((ulong)pcVar28->bits & 10) == 0) {
            piVar29 = &pcVar28->primary;
          }
          else {
            piVar29 = (ip_quadruple *)(pcVar28->host).name;
          }
          pcVar23 = (*Curl_cstrdup)(piVar29->remote_ip);
          (pcVar28->proto).ftpc.newhost = pcVar23;
          if (pcVar23 == (char *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
LAB_00128dad:
          CVar11 = pcVar28->bits;
          if (((ulong)CVar11 & 0x10) == 0) {
            if (((CVar11._0_4_ & 0x800040) == 0x800000) && (*pcVar23 == '\0')) {
              (*Curl_cfree)(pcVar23);
              (pcVar28->proto).ftpc.newhost = (char *)0x0;
              if (((ulong)pcVar28->bits & 10) == 0) {
                piVar29 = &pcVar28->primary;
              }
              else {
                piVar29 = (ip_quadruple *)(pcVar28->host).name;
              }
              pcVar23 = (*Curl_cstrdup)(piVar29->remote_ip);
              (pcVar28->proto).ftpc.newhost = pcVar23;
              if (pcVar23 == (char *)0x0) {
                return CURLE_OUT_OF_MEMORY;
              }
            }
            rVar18 = Curl_resolv(data,pcVar23,(uint)(pcVar28->proto).ftpc.newport,false,&addr);
            if (rVar18 == CURLRESOLV_PENDING) {
              Curl_resolver_wait_resolv(data,&addr);
            }
            uVar33 = (uint)(pcVar28->proto).ftpc.newport;
            if (addr == (Curl_dns_entry *)0x0) {
              Curl_failf(data,"cannot resolve new host %s:%hu",(pcVar28->proto).ftpc.newhost,
                         (ulong)uVar33);
              return CURLE_FTP_CANT_GET_HOST;
            }
          }
          else {
            ppVar13 = &pcVar28->socks_proxy;
            if (((ulong)CVar11 & 2) == 0) {
              ppVar13 = &pcVar28->http_proxy;
            }
            pcVar23 = (ppVar13->host).name;
            rVar18 = Curl_resolv(data,pcVar23,(pcVar28->primary).remote_port,false,&addr);
            if (rVar18 == CURLRESOLV_PENDING) {
              Curl_resolver_wait_resolv(data,&addr);
            }
            uVar33 = (pcVar28->primary).remote_port;
            if (addr == (Curl_dns_entry *)0x0) {
              Curl_failf(data,"cannot resolve proxy host %s:%hu",pcVar23,(ulong)(uVar33 & 0xffff));
              return CURLE_COULDNT_RESOLVE_PROXY;
            }
          }
          CVar16 = Curl_conn_setup(data,pcVar28,1,addr,*(uint *)&pcVar28->bits >> 0x11 & 1);
          if (CVar16 != CURLE_OK) {
            Curl_resolv_unlink(data,&addr);
            if ((int)local_190 != 0xe5) {
              return CVar16;
            }
            if ((pcVar28->proto).ftpc.count1 != 0) {
              return CVar16;
            }
            goto LAB_00128a4d;
          }
          if (((data->set).field_0x8cd & 0x10) != 0) {
            pcVar23 = (pcVar28->proto).ftpc.newhost;
            Curl_printable_address(addr->addr,(char *)&size,0x100);
            if ((((data->set).field_0x8cd & 0x10) != 0) &&
               ((pcVar10 = (data->state).feat, pcVar10 == (curl_trc_feat *)0x0 ||
                (0 < pcVar10->log_level)))) {
              Curl_infof(data,"Connecting to %s (%s) port %d",pcVar23,&size,(ulong)(uVar33 & 0xffff)
                        );
            }
          }
          Curl_resolv_unlink(data,&addr);
          (*Curl_cfree)(pcVar28->secondaryhostname);
          pcVar28->secondaryhostname = (char *)0x0;
          pcVar28->secondary_port = (pcVar28->proto).ftpc.newport;
          pcVar23 = (*Curl_cstrdup)((pcVar28->proto).ftpc.newhost);
          pcVar28->secondaryhostname = pcVar23;
          if (pcVar23 == (char *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
          puVar2 = &(pcVar28->bits).field_0x1;
          *puVar2 = *puVar2 | 0x10;
          goto switchD_001279eb_default;
        }
        pcVar23 = "Illegal port number in EPSV reply";
      }
      Curl_failf(data,pcVar23);
    }
    else {
      if ((int)local_190 == 0xe3 && iVar17 == 1) {
        local_180 = pcVar28;
LAB_00128515:
        if (*pcVar23 == '\0') {
LAB_00128a2f:
          Curl_failf(data,"Couldn\'t interpret the 227-response");
          return CURLE_FTP_WEIRD_227_FORMAT;
        }
        lVar35 = 0;
        pcVar24 = pcVar23;
        do {
          pcVar28 = local_180;
          if (lVar35 == 6) {
            if (*pcVar23 == '\0') goto LAB_00128a2f;
            uVar33 = (uint)*(undefined8 *)&(data->set).field_0x8ca;
            if ((uVar33 >> 0x10 & 1) == 0) {
              pcVar23 = curl_maprintf("%u.%u.%u.%u",size & 0xffffffff,(ulong)size._4_4_,
                                      uStack_130 & 0xffffffff,(ulong)uStack_130._4_4_);
              pcVar28 = local_180;
            }
            else {
              if (((uVar33 >> 0x1c & 1) != 0) &&
                 ((pcVar10 = (data->state).feat, pcVar10 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar10->log_level)))) {
                Curl_infof(data,"Skip %u.%u.%u.%u for data connection, reuse %s instead",
                           size & 0xffffffff,(ulong)size._4_4_,uStack_130 & 0xffffffff,
                           (ulong)uStack_130._4_4_,(local_180->host).name);
              }
              if (((ulong)pcVar28->bits & 10) == 0) {
                piVar29 = &pcVar28->primary;
              }
              else {
                piVar29 = (ip_quadruple *)(pcVar28->host).name;
              }
              pcVar23 = (*Curl_cstrdup)(piVar29->remote_ip);
            }
            (pcVar28->proto).ftpc.newhost = pcVar23;
            if (pcVar23 == (char *)0x0) {
              return CURLE_OUT_OF_MEMORY;
            }
            (pcVar28->proto).ftpc.newport =
                 (short)((int)local_128 << 8) + (short)(local_128 >> 0x20);
            goto LAB_00128dad;
          }
          if (lVar35 != 0) {
            if (*pcVar24 != ',') goto LAB_00128567;
            pcVar24 = pcVar24 + 1;
          }
          if ((9 < (byte)(*pcVar24 - 0x30U)) ||
             (uVar21 = strtoul(pcVar24,(char **)&filesize,10), 0xff < uVar21)) goto LAB_00128567;
          *(int *)((long)&size + lVar35 * 4) = (int)uVar21;
          lVar35 = lVar35 + 1;
          pcVar24 = (char *)filesize;
        } while( true );
      }
      if (iVar17 == 0) {
LAB_00128a4d:
        CVar16 = ftp_epsv_disable(data,pcVar28);
        return CVar16;
      }
      Curl_failf(data,"Bad PASV/EPSV response: %03d",local_190);
    }
    CVar16 = CURLE_FTP_WEIRD_PASV_REPLY;
    break;
  case '\x1f':
  case ' ':
    pcVar28 = data->conn;
    pFVar6 = (data->req).p.ftp;
    if ((ftpcode == 0x96) || (ftpcode == 0x7d)) {
      lVar35 = -1;
      size = -1;
      if ((fVar26 == '\x1f') ||
         (((((data->state).field_0x745 & 0x10) != 0 || (((data->set).field_0x8ce & 2) != 0)) ||
          (0 < pFVar6->downloadsize)))) {
        lVar7 = pFVar6->downloadsize;
        if (-1 < lVar7) {
          lVar35 = lVar7;
          size = lVar7;
        }
      }
      else {
        pcVar23 = Curl_dyn_ptr(&(pcVar28->proto).ftpc.pp.recvbuf);
        pcVar24 = strstr(pcVar23," bytes");
        if (pcVar24 != (char *)0x0) {
          pcVar23 = pcVar23 + (2 - (long)pcVar24);
          for (; (pcVar23 != (char *)0x0 && (pcVar24[-1] != '(')); pcVar24 = pcVar24 + -1) {
            if (9 < (byte)(pcVar24[-1] - 0x30U)) goto LAB_00127b5b;
            pcVar23 = pcVar23 + 1;
          }
          curlx_strtoofft(pcVar24,(char **)0x0,10,&size);
          lVar35 = size;
        }
      }
LAB_00127b5b:
      lVar7 = (data->req).maxdownload;
      if (lVar7 < 1 || lVar35 <= lVar7) {
        if ((fVar26 != '\x1f') && (((data->state).field_0x745 & 0x10) != 0)) {
          size = -1;
        }
      }
      else {
        (data->req).size = lVar7;
        size = lVar7;
      }
      if ((((data->set).field_0x8cd & 0x10) != 0) &&
         ((pcVar10 = (data->state).feat, pcVar10 == (curl_trc_feat *)0x0 || (0 < pcVar10->log_level)
          ))) {
        Curl_infof(data,"Maxdownload = %ld");
      }
      if (((fVar26 != '\x1f') && (((data->set).field_0x8cd & 0x10) != 0)) &&
         ((pcVar10 = (data->state).feat, pcVar10 == (curl_trc_feat *)0x0 || (0 < pcVar10->log_level)
          ))) {
        Curl_infof(data,"Getting file with size: %ld",size);
      }
      (pcVar28->proto).ftpc.state_saved = fVar26;
      (pcVar28->proto).ftpc.retr_size_saved = size;
      if (((data->set).field_0x8cb & 0x10) != 0) {
        CVar16 = AllowServerConnect(data,(_Bool *)&filesize);
        if (CVar16 != CURLE_OK) {
          return CVar16;
        }
        if ((char)filesize == '\0') {
          if ((((data->set).field_0x8cd & 0x10) != 0) &&
             ((pcVar10 = (data->state).feat, pcVar10 == (curl_trc_feat *)0x0 ||
              (0 < pcVar10->log_level)))) {
            Curl_infof(data,"Data conn was not available immediately");
          }
          _ftp_state(data,'\0');
          pbVar3 = (byte *)((long)&pcVar28->proto + 0x112);
          *pbVar3 = *pbVar3 | 0x20;
          return CURLE_OK;
        }
        return CURLE_OK;
      }
      goto LAB_001284cc;
    }
    if (ftpcode != 0x1c2 || fVar26 != '\x1f') {
      Curl_failf(data,"RETR response: %03d",(ulong)(uint)ftpcode);
      CVar16 = CURLE_REMOTE_FILE_NOT_FOUND;
      if (fVar26 != ' ') {
        CVar16 = CURLE_FTP_COULDNT_RETR_FILE;
      }
      if (ftpcode != 0x226) {
        return CURLE_FTP_COULDNT_RETR_FILE;
      }
      return CVar16;
    }
    pFVar6->transfer = PPTRANSFER_NONE;
  default:
switchD_001279eb_default:
    fVar26 = '\0';
LAB_00128bd7:
    CVar16 = CURLE_OK;
    _ftp_state(data,fVar26);
    break;
  case '!':
    if (399 < ftpcode) {
      Curl_failf(data,"Failed FTP upload: %0d");
      _ftp_state(data,'\0');
      return CURLE_UPLOAD_FAILED;
    }
    pcVar28 = data->conn;
    (pcVar28->proto).ftpc.state_saved = '!';
    if (((data->set).field_0x8cb & 0x10) != 0) {
      _ftp_state(data,'\0');
      CVar16 = AllowServerConnect(data,(_Bool *)&size);
      if (CVar16 != CURLE_OK) {
        return CVar16;
      }
      if ((char)size == '\0') {
        if ((((data->set).field_0x8cd & 0x10) != 0) &&
           ((pcVar10 = (data->state).feat, pcVar10 == (curl_trc_feat *)0x0 ||
            (0 < pcVar10->log_level)))) {
          Curl_infof(data,"Data conn was not available immediately");
        }
        pbVar3 = (byte *)((long)&pcVar28->proto + 0x112);
        *pbVar3 = *pbVar3 | 0x20;
        return CURLE_OK;
      }
      return CURLE_OK;
    }
LAB_001284cc:
    CVar16 = InitiateTransfer(data);
  }
  return CVar16;
LAB_00128567:
  pcVar23 = pcVar23 + 1;
  goto LAB_00128515;
LAB_00128992:
  if (pcVar23[1] == '\"') {
    if (pcVar23[2] != '\"') {
      sVar27 = Curl_dyn_len((dynbuf *)&size);
      if (sVar27 == 0) goto LAB_00128ca4;
      pcVar23 = Curl_dyn_ptr((dynbuf *)&size);
      if (((conn->proto).ftpc.server_os == (char *)0x0) && (*pcVar23 != '/')) {
        CVar16 = Curl_pp_sendf(data,&(pp->ftpc).pp,"%s","SYST");
        if (CVar16 == CURLE_OK) {
          (*Curl_cfree)((conn->proto).ftpc.entrypath);
          (conn->proto).ftpc.entrypath = pcVar23;
          if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
             ((pcVar10 = (data->state).feat, pcVar10 == (curl_trc_feat *)0x0 ||
              (0 < pcVar10->log_level)))) {
            Curl_infof(data,"Entry path is \'%s\'",pcVar23);
            pcVar23 = (conn->proto).ftpc.entrypath;
          }
          (data->state).most_recent_ftp_entrypath = pcVar23;
          _ftp_state(data,'\n');
          return CURLE_OK;
        }
        (*Curl_cfree)(pcVar23);
        return CVar16;
      }
      (*Curl_cfree)((conn->proto).ftpc.entrypath);
      (conn->proto).ftpc.entrypath = pcVar23;
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
         ((pcVar10 = (data->state).feat, pcVar10 == (curl_trc_feat *)0x0 || (0 < pcVar10->log_level)
          ))) {
        Curl_infof(data,"Entry path is \'%s\'",pcVar23);
        pcVar23 = (conn->proto).ftpc.entrypath;
      }
      (data->state).most_recent_ftp_entrypath = pcVar23;
      goto LAB_00128cdf;
    }
    pcVar23 = pcVar23 + 2;
  }
  else {
    if (pcVar23[1] == '\0') goto LAB_00128ca4;
    pcVar23 = pcVar23 + 1;
  }
  CVar16 = Curl_dyn_addn((dynbuf *)&size,pcVar23,1);
  if (CVar16 != CURLE_OK) {
    return CVar16;
  }
  goto LAB_00128992;
}

Assistant:

static CURLcode ftp_statemachine(struct Curl_easy *data,
                                 struct connectdata *conn)
{
  CURLcode result;
  int ftpcode;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct pingpong *pp = &ftpc->pp;
  static const char * const ftpauth[] = { "SSL", "TLS" };
  size_t nread = 0;

  if(pp->sendleft)
    return Curl_pp_flushsend(data, pp);

  result = ftp_readresp(data, FIRSTSOCKET, pp, &ftpcode, &nread);
  if(result)
    return result;

  if(ftpcode) {
    /* we have now received a full FTP server response */
    switch(ftpc->state) {
    case FTP_WAIT220:
      if(ftpcode == 230) {
        /* 230 User logged in - already! Take as 220 if TLS required. */
        if(data->set.use_ssl <= CURLUSESSL_TRY ||
           conn->bits.ftp_use_control_ssl)
          return ftp_state_user_resp(data, ftpcode);
      }
      else if(ftpcode != 220) {
        failf(data, "Got a %03d ftp-server response when 220 was expected",
              ftpcode);
        return CURLE_WEIRD_SERVER_REPLY;
      }

      /* We have received a 220 response fine, now we proceed. */
#ifdef HAVE_GSSAPI
      if(data->set.krb) {
        /* If not anonymous login, try a secure login. Note that this
           procedure is still BLOCKING. */

        Curl_sec_request_prot(conn, "private");
        /* We set private first as default, in case the line below fails to
           set a valid level */
        Curl_sec_request_prot(conn, data->set.str[STRING_KRB_LEVEL]);

        if(Curl_sec_login(data, conn)) {
          failf(data, "secure login failed");
          return CURLE_WEIRD_SERVER_REPLY;
        }
        infof(data, "Authentication successful");
      }
#endif

      if(data->set.use_ssl && !conn->bits.ftp_use_control_ssl) {
        /* We do not have a SSL/TLS control connection yet, but FTPS is
           requested. Try a FTPS connection now */

        ftpc->count3 = 0;
        switch(data->set.ftpsslauth) {
        case CURLFTPAUTH_DEFAULT:
        case CURLFTPAUTH_SSL:
          ftpc->count2 = 1; /* add one to get next */
          ftpc->count1 = 0;
          break;
        case CURLFTPAUTH_TLS:
          ftpc->count2 = -1; /* subtract one to get next */
          ftpc->count1 = 1;
          break;
        default:
          failf(data, "unsupported parameter to CURLOPT_FTPSSLAUTH: %d",
                (int)data->set.ftpsslauth);
          return CURLE_UNKNOWN_OPTION; /* we do not know what to do */
        }
        result = Curl_pp_sendf(data, &ftpc->pp, "AUTH %s",
                               ftpauth[ftpc->count1]);
        if(!result)
          ftp_state(data, FTP_AUTH);
      }
      else
        result = ftp_state_user(data, conn);
      break;

    case FTP_AUTH:
      /* we have gotten the response to a previous AUTH command */

      if(pp->overflow)
        return CURLE_WEIRD_SERVER_REPLY; /* Forbid pipelining in response. */

      /* RFC2228 (page 5) says:
       *
       * If the server is willing to accept the named security mechanism,
       * and does not require any security data, it must respond with
       * reply code 234/334.
       */

      if((ftpcode == 234) || (ftpcode == 334)) {
        /* this was BLOCKING, keep it so for now */
        bool done;
        if(!Curl_conn_is_ssl(conn, FIRSTSOCKET)) {
          result = Curl_ssl_cfilter_add(data, conn, FIRSTSOCKET);
          if(result) {
            /* we failed and bail out */
            return CURLE_USE_SSL_FAILED;
          }
        }
        result = Curl_conn_connect(data, FIRSTSOCKET, TRUE, &done);
        if(!result) {
          conn->bits.ftp_use_data_ssl = FALSE; /* clear-text data */
          conn->bits.ftp_use_control_ssl = TRUE; /* SSL on control */
          result = ftp_state_user(data, conn);
        }
      }
      else if(ftpc->count3 < 1) {
        ftpc->count3++;
        ftpc->count1 += ftpc->count2; /* get next attempt */
        result = Curl_pp_sendf(data, &ftpc->pp, "AUTH %s",
                               ftpauth[ftpc->count1]);
        /* remain in this same state */
      }
      else {
        if(data->set.use_ssl > CURLUSESSL_TRY)
          /* we failed and CURLUSESSL_CONTROL or CURLUSESSL_ALL is set */
          result = CURLE_USE_SSL_FAILED;
        else
          /* ignore the failure and continue */
          result = ftp_state_user(data, conn);
      }
      break;

    case FTP_USER:
    case FTP_PASS:
      result = ftp_state_user_resp(data, ftpcode);
      break;

    case FTP_ACCT:
      result = ftp_state_acct_resp(data, ftpcode);
      break;

    case FTP_PBSZ:
      result =
        Curl_pp_sendf(data, &ftpc->pp, "PROT %c",
                      data->set.use_ssl == CURLUSESSL_CONTROL ? 'C' : 'P');
      if(!result)
        ftp_state(data, FTP_PROT);
      break;

    case FTP_PROT:
      if(ftpcode/100 == 2)
        /* We have enabled SSL for the data connection! */
        conn->bits.ftp_use_data_ssl =
          (data->set.use_ssl != CURLUSESSL_CONTROL) ? TRUE : FALSE;
      /* FTP servers typically responds with 500 if they decide to reject
         our 'P' request */
      else if(data->set.use_ssl > CURLUSESSL_CONTROL)
        /* we failed and bails out */
        return CURLE_USE_SSL_FAILED;

      if(data->set.ftp_ccc) {
        /* CCC - Clear Command Channel
         */
        result = Curl_pp_sendf(data, &ftpc->pp, "%s", "CCC");
        if(!result)
          ftp_state(data, FTP_CCC);
      }
      else
        result = ftp_state_pwd(data, conn);
      break;

    case FTP_CCC:
      if(ftpcode < 500) {
        /* First shut down the SSL layer (note: this call will block) */
        /* This has only been tested on the proftpd server, and the mod_tls
         * code sends a close notify alert without waiting for a close notify
         * alert in response. Thus we wait for a close notify alert from the
         * server, but we do not send one. Let's hope other servers do
         * the same... */
        result = Curl_ssl_cfilter_remove(data, FIRSTSOCKET,
          (data->set.ftp_ccc == CURLFTPSSL_CCC_ACTIVE));

        if(result)
          failf(data, "Failed to clear the command channel (CCC)");
      }
      if(!result)
        /* Then continue as normal */
        result = ftp_state_pwd(data, conn);
      break;

    case FTP_PWD:
      if(ftpcode == 257) {
        char *ptr = Curl_dyn_ptr(&pp->recvbuf) + 4; /* start on the first
                                                       letter */
        bool entry_extracted = FALSE;
        struct dynbuf out;
        Curl_dyn_init(&out, 1000);

        /* Reply format is like
           257<space>[rubbish]"<directory-name>"<space><commentary> and the
           RFC959 says

           The directory name can contain any character; embedded
           double-quotes should be escaped by double-quotes (the
           "quote-doubling" convention).
        */

        /* scan for the first double-quote for non-standard responses */
        while(*ptr != '\n' && *ptr != '\0' && *ptr != '"')
          ptr++;

        if('\"' == *ptr) {
          /* it started good */
          for(ptr++; *ptr; ptr++) {
            if('\"' == *ptr) {
              if('\"' == ptr[1]) {
                /* "quote-doubling" */
                result = Curl_dyn_addn(&out, &ptr[1], 1);
                ptr++;
              }
              else {
                /* end of path */
                if(Curl_dyn_len(&out))
                  entry_extracted = TRUE;
                break; /* get out of this loop */
              }
            }
            else
              result = Curl_dyn_addn(&out, ptr, 1);
            if(result)
              return result;
          }
        }
        if(entry_extracted) {
          /* If the path name does not look like an absolute path (i.e.: it
             does not start with a '/'), we probably need some server-dependent
             adjustments. For example, this is the case when connecting to
             an OS400 FTP server: this server supports two name syntaxes,
             the default one being incompatible with standard paths. In
             addition, this server switches automatically to the regular path
             syntax when one is encountered in a command: this results in
             having an entrypath in the wrong syntax when later used in CWD.
               The method used here is to check the server OS: we do it only
             if the path name looks strange to minimize overhead on other
             systems. */
          char *dir = Curl_dyn_ptr(&out);

          if(!ftpc->server_os && dir[0] != '/') {
            result = Curl_pp_sendf(data, &ftpc->pp, "%s", "SYST");
            if(result) {
              free(dir);
              return result;
            }
            Curl_safefree(ftpc->entrypath);
            ftpc->entrypath = dir; /* remember this */
            infof(data, "Entry path is '%s'", ftpc->entrypath);
            /* also save it where getinfo can access it: */
            data->state.most_recent_ftp_entrypath = ftpc->entrypath;
            ftp_state(data, FTP_SYST);
            break;
          }

          Curl_safefree(ftpc->entrypath);
          ftpc->entrypath = dir; /* remember this */
          infof(data, "Entry path is '%s'", ftpc->entrypath);
          /* also save it where getinfo can access it: */
          data->state.most_recent_ftp_entrypath = ftpc->entrypath;
        }
        else {
          /* could not get the path */
          Curl_dyn_free(&out);
          infof(data, "Failed to figure out path");
        }
      }
      ftp_state(data, FTP_STOP); /* we are done with the CONNECT phase! */
      CURL_TRC_FTP(data, "[%s] protocol connect phase DONE", FTP_DSTATE(data));
      break;

    case FTP_SYST:
      if(ftpcode == 215) {
        char *ptr = Curl_dyn_ptr(&pp->recvbuf) + 4; /* start on the first
                                                       letter */
        char *os;
        char *start;

        /* Reply format is like
           215<space><OS-name><space><commentary>
        */
        while(*ptr == ' ')
          ptr++;
        for(start = ptr; *ptr && *ptr != ' '; ptr++)
          ;
        os = Curl_memdup0(start, ptr - start);
        if(!os)
          return CURLE_OUT_OF_MEMORY;

        /* Check for special servers here. */
        if(strcasecompare(os, "OS/400")) {
          /* Force OS400 name format 1. */
          result = Curl_pp_sendf(data, &ftpc->pp, "%s", "SITE NAMEFMT 1");
          if(result) {
            free(os);
            return result;
          }
          /* remember target server OS */
          Curl_safefree(ftpc->server_os);
          ftpc->server_os = os;
          ftp_state(data, FTP_NAMEFMT);
          break;
        }
        /* Nothing special for the target server. */
        /* remember target server OS */
        Curl_safefree(ftpc->server_os);
        ftpc->server_os = os;
      }
      else {
        /* Cannot identify server OS. Continue anyway and cross fingers. */
      }

      ftp_state(data, FTP_STOP); /* we are done with the CONNECT phase! */
      CURL_TRC_FTP(data, "[%s] protocol connect phase DONE", FTP_DSTATE(data));
      break;

    case FTP_NAMEFMT:
      if(ftpcode == 250) {
        /* Name format change successful: reload initial path. */
        ftp_state_pwd(data, conn);
        break;
      }

      ftp_state(data, FTP_STOP); /* we are done with the CONNECT phase! */
      CURL_TRC_FTP(data, "[%s] protocol connect phase DONE", FTP_DSTATE(data));
      break;

    case FTP_QUOTE:
    case FTP_POSTQUOTE:
    case FTP_RETR_PREQUOTE:
    case FTP_STOR_PREQUOTE:
      if((ftpcode >= 400) && !ftpc->count2) {
        /* failure response code, and not allowed to fail */
        failf(data, "QUOT command failed with %03d", ftpcode);
        result = CURLE_QUOTE_ERROR;
      }
      else
        result = ftp_state_quote(data, FALSE, ftpc->state);
      break;

    case FTP_CWD:
      if(ftpcode/100 != 2) {
        /* failure to CWD there */
        if(data->set.ftp_create_missing_dirs &&
           ftpc->cwdcount && !ftpc->count2) {
          /* try making it */
          ftpc->count2++; /* counter to prevent CWD-MKD loops */

          /* count3 is set to allow MKD to fail once per dir. In the case when
          CWD fails and then MKD fails (due to another session raced it to
          create the dir) this then allows for a second try to CWD to it. */
          ftpc->count3 = (data->set.ftp_create_missing_dirs == 2) ? 1 : 0;

          result = Curl_pp_sendf(data, &ftpc->pp, "MKD %s",
                                 ftpc->dirs[ftpc->cwdcount - 1]);
          if(!result)
            ftp_state(data, FTP_MKD);
        }
        else {
          /* return failure */
          failf(data, "Server denied you to change to the given directory");
          ftpc->cwdfail = TRUE; /* do not remember this path as we failed
                                   to enter it */
          result = CURLE_REMOTE_ACCESS_DENIED;
        }
      }
      else {
        /* success */
        ftpc->count2 = 0;
        if(++ftpc->cwdcount <= ftpc->dirdepth)
          /* send next CWD */
          result = Curl_pp_sendf(data, &ftpc->pp, "CWD %s",
                                 ftpc->dirs[ftpc->cwdcount - 1]);
        else
          result = ftp_state_mdtm(data);
      }
      break;

    case FTP_MKD:
      if((ftpcode/100 != 2) && !ftpc->count3--) {
        /* failure to MKD the dir */
        failf(data, "Failed to MKD dir: %03d", ftpcode);
        result = CURLE_REMOTE_ACCESS_DENIED;
      }
      else {
        ftp_state(data, FTP_CWD);
        /* send CWD */
        result = Curl_pp_sendf(data, &ftpc->pp, "CWD %s",
                               ftpc->dirs[ftpc->cwdcount - 1]);
      }
      break;

    case FTP_MDTM:
      result = ftp_state_mdtm_resp(data, ftpcode);
      break;

    case FTP_TYPE:
    case FTP_LIST_TYPE:
    case FTP_RETR_TYPE:
    case FTP_STOR_TYPE:
      result = ftp_state_type_resp(data, ftpcode, ftpc->state);
      break;

    case FTP_SIZE:
    case FTP_RETR_SIZE:
    case FTP_STOR_SIZE:
      result = ftp_state_size_resp(data, ftpcode, ftpc->state);
      break;

    case FTP_REST:
    case FTP_RETR_REST:
      result = ftp_state_rest_resp(data, conn, ftpcode, ftpc->state);
      break;

    case FTP_PRET:
      if(ftpcode != 200) {
        /* there only is this one standard OK return code. */
        failf(data, "PRET command not accepted: %03d", ftpcode);
        return CURLE_FTP_PRET_FAILED;
      }
      result = ftp_state_use_pasv(data, conn);
      break;

    case FTP_PASV:
      result = ftp_state_pasv_resp(data, ftpcode);
      break;

    case FTP_PORT:
      result = ftp_state_port_resp(data, ftpcode);
      break;

    case FTP_LIST:
    case FTP_RETR:
      result = ftp_state_get_resp(data, ftpcode, ftpc->state);
      break;

    case FTP_STOR:
      result = ftp_state_stor_resp(data, ftpcode, ftpc->state);
      break;

    case FTP_QUIT:
    default:
      /* internal error */
      ftp_state(data, FTP_STOP);
      break;
    }
  } /* if(ftpcode) */

  return result;
}